

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbif.cpp
# Opt level: O0

void __thiscall CVmBifTable::clear(CVmBifTable *this)

{
  long *in_RDI;
  size_t i;
  vm_bif_entry_t *this_00;
  ulong uVar1;
  
  if (*in_RDI != 0) {
    for (this_00 = (vm_bif_entry_t *)0x0; this_00 < (vm_bif_entry_t *)(ulong)*(ushort *)(in_RDI + 2)
        ; this_00 = (vm_bif_entry_t *)((long)&this_00->func_set_id + 1)) {
      if (*(long *)(*in_RDI + (long)this_00 * 8) != 0) {
        vm_bif_entry_t::unload_image(this_00,(int)((ulong)in_RDI >> 0x20));
      }
    }
  }
  if (in_RDI[1] != 0) {
    for (uVar1 = 0; uVar1 < *(ushort *)(in_RDI + 2); uVar1 = uVar1 + 1) {
      lib_free_str((char *)0x29fbc2);
    }
  }
  *(undefined2 *)(in_RDI + 2) = 0;
  return;
}

Assistant:

void CVmBifTable::clear(VMG0_)
{
    size_t i;

    /* detach each function set */
    if (table_ != 0)
    {
        for (i = 0 ; i < count_ ; ++i)
        {
            if (table_[i] != 0)
                table_[i]->unload_image(vmg_ i);
        }
    }

    /* delete the 'names' entries, if we allocated any */
    if (names_ != 0)
    {
        /* free each element */
        for (i = 0 ; i < count_ ; ++i)
            lib_free_str(names_[i]);
    }

    /* 
     *   Reset the entry counter.  Note that this doesn't affect any
     *   allocation; we keep a separate count of the number of table slots
     *   we have allocated.  Table slots don't have any additional
     *   associated memory, so we don't need to worry about cleaning
     *   anything up at this point.  
     */
    count_ = 0;
}